

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

FunctionBody * __thiscall
Js::ParseableFunctionInfo::Parse
          (ParseableFunctionInfo *this,ScriptFunction **functionRef,bool isByteCodeDeserialization)

{
  undefined1 *puVar1;
  byte *pbVar2;
  byte bVar3;
  ushort uVar4;
  int iVar5;
  uint uVar6;
  uint sourceIndex;
  SourceContextInfo *pSVar7;
  NestedArray *pNVar8;
  SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *this_00;
  ParseableFunctionInfo *this_01;
  ScriptContext *pSVar9;
  ThreadContext *pTVar10;
  Type pSVar11;
  code *pcVar12;
  uint32 grfscr;
  char16_t *pcVar13;
  ParseNodeProg *pnode;
  bool bVar14;
  bool bVar15;
  BOOL BVar16;
  LocalFunctionId functionID;
  int iVar17;
  uint uVar18;
  HRESULT HVar19;
  undefined4 *puVar20;
  FunctionBody *pFVar21;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Utf8SourceInfo *pUVar22;
  LPCUTF8 pSrc;
  undefined4 extraout_var_02;
  ScopeInfo *parentScopeInfo;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined8 extraout_RAX;
  undefined8 uVar23;
  uint uVar24;
  uint7 in_register_00000011;
  undefined4 uVar25;
  uint uVar26;
  uint7 uVar27;
  uint uVar28;
  ulong uVar29;
  undefined1 local_c08 [8];
  char16 debugStringBuffer [42];
  undefined1 local_160 [8];
  LeaveScriptObject<true,_false,_false> __leaveScriptObject;
  CompileScriptException se;
  uint nextFunctionId;
  undefined1 auStack_b8 [8];
  AutoRestoreFunctionInfo autoRestoreFunctionInfo;
  ParseNodeProg *local_98;
  ParseNodeProg *parseTree;
  AutoDynamicCodeReference dynamicFunctionReference;
  ParseableFunctionInfo *rootFunc;
  HRESULT local_5c;
  FunctionBody *pFStack_58;
  HRESULT hrParser;
  byte local_4a;
  byte local_49;
  Type local_48;
  undefined4 local_44;
  int local_40;
  AutoHandledExceptionType local_3a;
  bool local_39;
  byte bStack_38;
  AutoHandledExceptionType __autoHandledExceptionType;
  undefined7 uStack_37;
  
  uVar27 = in_register_00000011 & 0xffffff;
  if ((ParseableFunctionInfo *)
      (((this->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar20 = 1;
    bVar14 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0x8f2,"(this == this->GetFunctionInfo()->GetFunctionProxy())",
                                 "this == this->GetFunctionInfo()->GetFunctionProxy()");
    if (!bVar14) goto LAB_006ca9d9;
    *puVar20 = 0;
  }
  BVar16 = FunctionProxy::IsDeferredParseFunction(&this->super_FunctionProxy);
  if (BVar16 == 0) {
    pFVar21 = FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
    bVar14 = IsFunctionParsed(&pFVar21->super_ParseableFunctionInfo);
    if (bVar14) {
LAB_006c9ceb:
      pFVar21 = FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
      return pFVar21;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar20 = 1;
    bVar14 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                 ,0x8f6,"(GetFunctionBody()->IsFunctionParsed())",
                                 "GetFunctionBody()->IsFunctionParsed()");
    if (bVar14) {
      *puVar20 = 0;
      goto LAB_006c9ceb;
    }
    goto LAB_006ca9d9;
  }
  autoRestoreFunctionInfo.pfi = (ParseableFunctionInfo *)0x0;
  autoRestoreFunctionInfo.funcBody =
       (FunctionBody *)InterpreterStackFrame::DelayDynamicInterpreterThunk;
  auStack_b8 = (undefined1  [8])this;
  if (((this->super_FunctionProxy).field_0x45 & 2) == 0) {
    pUVar22 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
    functionID = FunctionProxy::GetLocalFunctionId(&this->super_FunctionProxy);
    Utf8SourceInfo::StopTrackingDeferredFunction(pUVar22,functionID);
    pFVar21 = FunctionBody::NewFromParseableFunctionInfo(this);
    pSVar7 = (((((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->
             sourceContextInfo).ptr;
    autoRestoreFunctionInfo.pfi = &pFVar21->super_ParseableFunctionInfo;
    if ((pSVar7->dwHostSourceContext == 0xffffffffffffffff) ||
       ((pSVar7->isHostDynamicDocument & 1U) != 0)) {
      bVar14 = Phases::IsEnabled((Phases *)&DAT_014594b0,DeferParsePhase);
      if (bVar14) {
        uVar18 = (this->super_FunctionProxy).m_functionNumber;
        iVar17 = (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[7])(this);
        pNVar8 = (this->nestedArray).ptr;
        if (pNVar8 == (NestedArray *)0x0) {
          uVar29 = 0;
        }
        else {
          uVar29 = (ulong)pNVar8->nestedCount;
        }
        pUVar22 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
        pcVar13 = L"LdTrue";
        if (((this->super_FunctionProxy).field_0x44 & 2) == 0) {
          pcVar13 = L"LdFalse";
        }
        Output::Print(L"TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d\n; Is Top Level: %s;"
                      ,(ulong)uVar18,CONCAT44(extraout_var_01,iVar17),(ulong)this->m_cchLength,
                      uVar29,(ulong)pUVar22->m_sourceInfoId,(ulong)pUVar22->m_cchLength,pcVar13 + 2)
        ;
        goto LAB_006c9ee7;
      }
    }
    else {
      bVar14 = Phases::IsEnabled((Phases *)&DAT_014594b0,DeferParsePhase);
      if (bVar14) {
        uVar18 = (this->super_FunctionProxy).m_functionNumber;
        iVar17 = (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[7])(this);
        pNVar8 = (this->nestedArray).ptr;
        if (pNVar8 == (NestedArray *)0x0) {
          uVar29 = 0;
        }
        else {
          uVar29 = (ulong)pNVar8->nestedCount;
        }
        pUVar22 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
        pcVar13 = L"LdTrue";
        if (((this->super_FunctionProxy).field_0x44 & 2) == 0) {
          pcVar13 = L"LdFalse";
        }
        Output::Print(L"TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d; Is Top Level: %s; Source Url: %s\n"
                      ,(ulong)uVar18,CONCAT44(extraout_var,iVar17),(ulong)this->m_cchLength,uVar29,
                      (ulong)pUVar22->m_sourceInfoId,(ulong)pUVar22->m_cchLength,pcVar13 + 2,
                      (((((pUVar22->m_srcInfo).ptr)->sourceContextInfo).ptr)->field_5).field_0.url);
LAB_006c9ee7:
        Output::Flush();
      }
    }
    if (((this->super_FunctionProxy).field_0x44 & 2) == 0) {
      pSVar7 = (((((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->
               sourceContextInfo).ptr;
      uVar25 = 0;
      if ((pSVar7->dwHostSourceContext == 0xffffffffffffffff) ||
         ((pSVar7->isHostDynamicDocument & 1U) != 0)) goto LAB_006ca0bd;
      bVar14 = ScriptContext::DoUndeferGlobalFunctions((this->super_FunctionProxy).m_scriptContext);
      if (bVar14) {
        pUVar22 = (this->super_FunctionProxy).m_utf8SourceInfo.ptr;
        bVar14 = ScriptContext::DoUndeferGlobalFunctions((pUVar22->m_scriptContext).ptr);
        if (bVar14) {
          if ((pUVar22->field_0xa8 & 1) == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar20 = 1;
            bVar14 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/Utf8SourceInfo.h"
                                         ,0x14e,"(m_deferredFunctionsInitialized)",
                                         "m_deferredFunctionsInitialized");
            if (!bVar14) goto LAB_006ca9d9;
            *puVar20 = 0;
          }
          this_00 = (pUVar22->m_deferredFunctionsDictionary).ptr;
          if (this_00 !=
              (SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
               *)0x0) {
            (pUVar22->m_deferredFunctionsDictionary).ptr =
                 (SynchronizedDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_Js::DefaultContainerLockPolicy,_CriticalSection>
                  *)0x0;
            local_c08 = (undefined1  [8])this_00->syncObj;
            CCLock::Enter((CCLock *)local_c08);
            pFStack_58 = pFVar21;
            for (uVar29 = 0; pFVar21 = pFStack_58,
                uVar29 < (this_00->
                         super_BaseDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                         ).bucketCount; uVar29 = uVar29 + 1) {
              iVar17 = (this_00->
                       super_BaseDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                       ).buckets.ptr[uVar29];
              if (iVar17 != -1) {
                while (iVar17 != -1) {
                  this_01 = (this_00->
                            super_BaseDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                            ).entries.ptr[iVar17].
                            super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ParseableFunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                            .
                            super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ParseableFunctionInfo>_>
                            .
                            super_ValueEntry<Memory::WriteBarrierPtr<Js::ParseableFunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::ParseableFunctionInfo>_>_>
                            .
                            super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::ParseableFunctionInfo>_>
                            .value.ptr;
                  if (this_01 != this && this_01 != (ParseableFunctionInfo *)0x0) {
                    Parse(this_01,(ScriptFunction **)0x0,false);
                  }
                  iVar5 = (this_00->
                          super_BaseDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                          ).entries.ptr[iVar17].
                          super_DefaultHashedEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ParseableFunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                          .
                          super_KeyValueEntry<unsigned_int,_Memory::WriteBarrierPtr<Js::ParseableFunctionInfo>_>
                          .
                          super_ValueEntry<Memory::WriteBarrierPtr<Js::ParseableFunctionInfo>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::ParseableFunctionInfo>_>_>
                          .
                          super_KeyValueEntryDataLayout2<unsigned_int,_Memory::WriteBarrierPtr<Js::ParseableFunctionInfo>_>
                          .next;
                  JsUtil::
                  BaseDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                  ::RemoveAt(&this_00->
                              super_BaseDictionary<unsigned_int,_Js::ParseableFunctionInfo_*,_Memory::RecyclerLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                             ,iVar17,-1,(uint)uVar29);
                  iVar17 = iVar5;
                }
              }
            }
            AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)local_c08);
            uVar25 = 0;
            goto LAB_006ca0bd;
          }
        }
      }
    }
LAB_006ca0bb:
    uVar25 = 0;
  }
  else {
    bVar14 = ScriptContext::IsScriptContextInSourceRundownOrDebugMode
                       ((this->super_FunctionProxy).m_scriptContext);
    if (bVar14) {
      bVar14 = (((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->field_0xa8 & 4) == 0;
    }
    else {
      bVar14 = false;
      uVar27 = 0;
    }
    uVar4 = *(ushort *)&(this->super_FunctionProxy).field_0x45;
    pFVar21 = FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
    auStack_b8 = (undefined1  [8])0x0;
    autoRestoreFunctionInfo.pfi = (ParseableFunctionInfo *)0x0;
    if ((bool)(~bVar14 & (uVar4 >> 9 & 1) == 0)) goto LAB_006ca0bb;
    if (((((pFVar21->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47 & 0x10) == 0) &&
        (bVar14 = ScriptContext::IsScriptContextInSourceRundownOrDebugMode
                            ((this->super_FunctionProxy).m_scriptContext), !bVar14)) &&
       (((this->super_FunctionProxy).field_0x46 & 2) == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar20 = 1;
      bVar14 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                   ,0x955,
                                   "(funcBody->IsReparsed() || m_scriptContext->IsScriptContextInSourceRundownOrDebugMode() || m_isAsmjsMode)"
                                   ,
                                   "funcBody->IsReparsed() || m_scriptContext->IsScriptContextInSourceRundownOrDebugMode() || m_isAsmjsMode"
                                  );
      if (!bVar14) goto LAB_006ca9d9;
      *puVar20 = 0;
    }
    iVar17 = (*(pFVar21->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(pFVar21);
    FunctionProxy::GetDebugNumberSet((FunctionProxy *)pFVar21,(wchar (*) [42])local_c08);
    Output::Trace(DebuggerPhase,L"Full nested reparse of function: %s (%s)\n",
                  CONCAT44(extraout_var_00,iVar17),local_c08);
    if ((pFVar21->byteCodeBlock).ptr != (ByteBlock *)0x0) {
      CleanupToReparse(&pFVar21->super_ParseableFunctionInfo);
    }
    uVar25 = (undefined4)CONCAT71(uVar27,1);
  }
LAB_006ca0bd:
  pFStack_58 = pFVar21;
  if ((pFVar21->byteCodeBlock).ptr == (ByteBlock *)0x0) {
    if ((pFVar21->field_0x179 & 1) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar20 = 1;
      bVar14 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                   ,0x968,"(!funcBody->HasExecutionDynamicProfileInfo())",
                                   "!funcBody->HasExecutionDynamicProfileInfo()");
      if (!bVar14) goto LAB_006ca9d9;
      *puVar20 = 0;
    }
    local_5c = 0;
    local_44 = uVar25;
    LeaveScriptObject<true,_false,_false>::LeaveScriptObject
              ((LeaveScriptObject<true,_false,_false> *)local_160,
               (this->super_FunctionProxy).m_scriptContext,&stack0xfffffffffffffff8);
    pSVar9 = (this->super_FunctionProxy).m_scriptContext;
    pTVar10 = pSVar9->threadContext;
    local_39 = pTVar10->reentrancySafeOrHandled;
    pTVar10->reentrancySafeOrHandled = true;
    pUVar22 = ScriptContext::GetSource(pSVar9,(pFVar21->super_ParseableFunctionInfo).m_sourceIndex);
    local_4a = pUVar22->field_0xa8;
    uVar18 = this->m_cbStartOffset;
    local_48 = this->m_cchStartOffset;
    uVar6 = this->m_cbLength;
    pSrc = GetStartOfDocument(this,(char16 *)0x0);
    pFVar21 = pFStack_58;
    uVar26 = (pFStack_58->super_ParseableFunctionInfo).m_grfscr;
    uVar4 = *(ushort *)&(pFStack_58->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45;
    bVar3 = (pFStack_58->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
    bVar14 = FunctionProxy::IsAsync((FunctionProxy *)pFStack_58);
    _bStack_38 = CONCAT71(uStack_37,bVar14);
    bVar14 = FunctionProxy::IsGenerator((FunctionProxy *)pFVar21);
    local_40 = CONCAT31(local_40._1_3_,bVar14);
    bVar14 = FunctionProxy::IsClassConstructor((FunctionProxy *)pFVar21);
    local_49 = FunctionProxy::IsBaseClassConstructor((FunctionProxy *)pFVar21);
    bVar15 = FunctionProxy::IsClassMethod((FunctionProxy *)pFVar21);
    uVar28 = uVar26 | 0x800000;
    uVar26 = uVar26 & 0xffffefff;
    uVar24 = uVar26 | 0x800000;
    uVar26 = uVar26 | 0x1800000;
    if ((uVar4 >> 0xc & 1) != 0) {
      uVar24 = uVar28;
      uVar26 = uVar28;
    }
    if ((uVar4 & 4) == 0) {
      uVar24 = uVar26;
    }
    uVar26 = (bVar3 & 0x20) << 0x15;
    grfscr = (uint)bVar15 << 0x1c |
             (uint)local_49 << 0x1e |
             local_40 << 0x1b | (uint)bStack_38 << 0x19 | uVar26 | uVar24 & 0x81ffbef7 |
             (uint)bVar14 << 0x1d | 0x4000;
    if ((char)local_44 == '\0') {
      grfscr = (uint)bVar15 << 0x1c |
               (uint)local_49 << 0x1e |
               local_40 << 0x1b | (uint)bStack_38 << 0x19 | uVar26 | uVar24 & 0x81ffffff |
               (uint)bVar14 << 0x1d;
    }
    AutoHandledExceptionType::AutoHandledExceptionType
              (&local_3a,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
    pFVar21 = pFStack_58;
    se.hasLineNumberInfo = false;
    se._81_7_ = 0;
    __leaveScriptObject.__exceptionCheck.handledExceptionType = ExceptionType_None;
    __leaveScriptObject._36_4_ = 0;
    se.super_ScriptException.ichMin = 0;
    se.super_ScriptException.ichLim = 0;
    se.super_ScriptException.ei.wCode = 0;
    se.super_ScriptException.ei.wReserved = 0;
    se.super_ScriptException.ei._4_4_ = 0;
    se.super_ScriptException.ei.bstrSource = (BSTR)0x0;
    se.super_ScriptException.ei.bstrDescription = (BSTR)0x0;
    se.super_ScriptException.ei.bstrHelpFile = (BSTR)0x0;
    se.super_ScriptException.ei.dwHelpContext = 0;
    se.super_ScriptException.ei._36_4_ = 0;
    se.super_ScriptException.ei.pvReserved = (PVOID)0x0;
    se.super_ScriptException.ei.pfnDeferredFillIn = (_func_HRESULT_tagEXCEPINFO_ptr *)0x0;
    se.super_ScriptException.ei.scode = 0;
    se.super_ScriptException.ei._60_4_ = 0;
    se.line._0_1_ = 0;
    Parser::Parser((Parser *)local_c08,(this->super_FunctionProxy).m_scriptContext,
                   *(ushort *)
                    &(pFStack_58->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 >> 8 &
                   1,(PageAllocator *)0x0,false,0xaa8);
    local_98 = (ParseNodeProg *)0x0;
    _bStack_38 = 0;
    se.bstrLine._4_4_ = FunctionProxy::GetLocalFunctionId((FunctionProxy *)pFVar21);
    local_5c = Parser::ParseSourceWithOffset
                         ((Parser *)local_c08,&local_98,pSrc,(ulong)uVar18,(ulong)uVar6,local_48,
                          (bool)((local_4a & 2) >> 1),grfscr,
                          (CompileScriptException *)&__leaveScriptObject.__exceptionCheck,
                          (LocalFunctionId *)((long)&se.bstrLine + 4),
                          (pFStack_58->super_ParseableFunctionInfo).m_lineNumber,
                          (((((pFStack_58->super_ParseableFunctionInfo).super_FunctionProxy.
                              m_utf8SourceInfo.ptr)->m_srcInfo).ptr)->sourceContextInfo).ptr,
                          &pFStack_58->super_ParseableFunctionInfo);
    if (local_5c < 0) {
      HVar19 = MapDeferredReparseError
                         (&local_5c,(CompileScriptException *)&__leaveScriptObject.__exceptionCheck)
      ;
      _bStack_38 = CONCAT44(extraout_var_04,HVar19);
      if (HVar19 == -0x7ff5ebe4) {
        _bStack_38 = 0x800a141c;
      }
      else if ((-1 < HVar19) || (local_5c < 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar20 = 1;
        bVar14 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                     ,0x9d7,
                                     "(hrParseCodeGen == JSERR_AsmJsCompileError || (((HRESULT)(hrParseCodeGen)<0) && ((HRESULT)(hrParser) >= 0)))"
                                     ,"Syntax errors should never be detected on deferred re-parse")
        ;
        if (!bVar14) goto LAB_006ca9d9;
        *puVar20 = 0;
      }
      bVar14 = false;
    }
    else {
      bVar14 = Phases::IsEnabled((Phases *)&DAT_01453738,ByteCodePhase);
      if (bVar14) {
        iVar17 = (*(pFStack_58->super_ParseableFunctionInfo).super_FunctionProxy.
                   super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                   [7])();
        _bStack_38 = 0;
        Output::Print(L"\nDeferred parse %s\n",CONCAT44(extraout_var_02,iVar17));
      }
      parseTree = (ParseNodeProg *)(this->super_FunctionProxy).m_scriptContext;
      JavascriptLibrary::BeginDynamicFunctionReferences
                ((((Type)parseTree)->super_ScriptContextBase).javascriptLibrary);
      _bStack_38 = 0;
      bVar14 = false;
      if ((char)local_44 != '\0') {
        bVar14 = (((this->super_FunctionProxy).m_scriptContext)->config).NoNative;
      }
      dynamicFunctionReference.m_scriptContext =
           (ScriptContext *)FunctionProxy::GetParseableFunctionInfo((FunctionProxy *)pFStack_58);
      pnode = local_98;
      pSVar9 = (this->super_FunctionProxy).m_scriptContext;
      sourceIndex = (pFStack_58->super_ParseableFunctionInfo).m_sourceIndex;
      parentScopeInfo =
           FunctionProxy::GetAuxPtr<(Js::FunctionProxy::AuxPointerType)20,Js::ScopeInfo*>
                     ((FunctionProxy *)pFStack_58);
      uVar18 = GenerateByteCode(pnode,grfscr,pSVar9,
                                (ParseableFunctionInfo **)&dynamicFunctionReference,sourceIndex,
                                bVar14,(Parser *)local_c08,
                                (CompileScriptException *)&__leaveScriptObject.__exceptionCheck,
                                parentScopeInfo,functionRef);
      _bStack_38 = CONCAT44(extraout_var_03,uVar18);
      FunctionProxy::SetParseableFunctionInfo
                ((FunctionProxy *)pFStack_58,
                 (ParseableFunctionInfo *)dynamicFunctionReference.m_scriptContext);
      bVar14 = -1 < (int)uVar18;
      if (!bVar14) {
        if (uVar18 != 0x86664004) {
          AssertCount = AssertCount + 1;
          _bStack_38 = (ulong)uVar18;
          Throw::LogAssert();
          puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar20 = 1;
          _bStack_38 = (ulong)uVar18;
          bVar15 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                       ,0x9ec,"(hrParseCodeGen == ((HRESULT)0x86664004L))",
                                       "hrParseCodeGen == SCRIPT_E_RECORDED");
          if (!bVar15) goto LAB_006ca9d9;
          *puVar20 = 0;
        }
        uVar18 = (uint)se.super_ScriptException.ei.pfnDeferredFillIn;
      }
      AutoDynamicCodeReference::~AutoDynamicCodeReference((AutoDynamicCodeReference *)&parseTree);
      _bStack_38 = (ulong)uVar18;
    }
    Parser::~Parser((Parser *)local_c08);
    CompileScriptException::~CompileScriptException
              ((CompileScriptException *)&__leaveScriptObject.__exceptionCheck);
    AutoHandledExceptionType::~AutoHandledExceptionType(&local_3a);
    local_48 = (Type)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    local_44 = 0;
    local_40 = 0;
    pSVar11 = (this->super_FunctionProxy).m_scriptContext;
    if (pSVar11 != (Type)0x0) {
      ThreadContext::DisposeOnLeaveScript(pSVar11->threadContext);
    }
    pTVar10->reentrancySafeOrHandled = local_39;
    LeaveScriptObject<true,_false,_false>::~LeaveScriptObject
              ((LeaveScriptObject<true,_false,_false> *)local_160);
    if ((char)local_44 != '\0') {
      JavascriptError::ThrowOutOfMemoryError((this->super_FunctionProxy).m_scriptContext);
    }
    if ((char)local_40 == '\x01') {
      uVar23 = __cxa_allocate_exception(1);
      __cxa_throw(uVar23,&NotImplementedException::typeinfo,0);
    }
    if ((char)local_48 == '\0') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar20 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar20 = 1;
      bVar15 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                   ,0x9f7,"(hr == 0L)","hr == NO_ERROR");
      if (!bVar15) {
LAB_006ca9d9:
        pcVar12 = (code *)invalidInstructionException();
        (*pcVar12)();
      }
      *puVar20 = 0;
    }
    if (local_5c < 0) {
      JavascriptError::ThrowError
                ((this->super_FunctionProxy).m_scriptContext,-0x7ff5ffcd,(PCWSTR)0x0);
    }
    iVar17 = (int)_bStack_38;
    if (iVar17 < 0) {
      if (iVar17 != -0x7ff5ebe4) {
        if (iVar17 != -0x7ff5ffe4) {
          JavascriptError::MapAndThrowError((this->super_FunctionProxy).m_scriptContext,iVar17);
        }
        JavascriptError::ThrowStackOverflowError
                  ((this->super_FunctionProxy).m_scriptContext,(PVOID)0x0);
      }
      bVar15 = true;
      goto LAB_006ca6dd;
    }
  }
  else {
    bVar14 = false;
  }
  auStack_b8 = (undefined1  [8])0x0;
  autoRestoreFunctionInfo.pfi = (ParseableFunctionInfo *)0x0;
  bVar15 = false;
LAB_006ca6dd:
  AutoRestoreFunctionInfo::~AutoRestoreFunctionInfo((AutoRestoreFunctionInfo *)auStack_b8);
  if (bVar14) {
    *(ushort *)&(pFStack_58->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 =
         *(ushort *)&(pFStack_58->super_ParseableFunctionInfo).super_FunctionProxy.field_0x45 &
         0xffbf | *(ushort *)&(this->super_FunctionProxy).field_0x45 & 0x40;
    puVar1 = &(this->super_FunctionProxy).field_0x45;
    *puVar1 = *puVar1 | 2;
    if (!bVar15) {
      return pFStack_58;
    }
  }
  else if (!bVar15) {
    pFVar21 = FunctionProxy::GetFunctionBody(&this->super_FunctionProxy);
    return pFVar21;
  }
  pbVar2 = (byte *)((long)&this->m_grfscr + 1);
  *pbVar2 = *pbVar2 | 0x40;
  pFVar21 = Parse(this,functionRef,isByteCodeDeserialization);
  return pFVar21;
}

Assistant:

FunctionBody* ParseableFunctionInfo::Parse(ScriptFunction ** functionRef, bool isByteCodeDeserialization)
    {
        Assert(this == this->GetFunctionInfo()->GetFunctionProxy());
        if (!IsDeferredParseFunction())
        {
            // If not deferredparsed, the functionBodyImpl and this will be the same, just return the current functionBody.
            Assert(GetFunctionBody()->IsFunctionParsed());
            return GetFunctionBody();
        }

        bool asmjsParseFailed = false;
        BOOL fParsed = FALSE;
        FunctionBody* returnFunctionBody = nullptr;

        bool isDebugOrAsmJsReparse = false;
        FunctionBody* funcBody = nullptr;

        {
            AutoRestoreFunctionInfo autoRestoreFunctionInfo(this, DefaultEntryThunk);


            // If m_hasBeenParsed = true, one of the following things happened things happened:
            // - We had multiple function objects which were all defer-parsed, but with the same function body and one of them
            //   got the body to be parsed before another was called
            // - We are in debug mode and had our thunks switched to DeferParseThunk
            // - This is an already parsed asm.js module, which has been invalidated at link time and must be reparsed as a non-asm.js function
            if (!this->m_hasBeenParsed)
            {
                this->GetUtf8SourceInfo()->StopTrackingDeferredFunction(this->GetLocalFunctionId());
                funcBody = FunctionBody::NewFromParseableFunctionInfo(this);
                autoRestoreFunctionInfo.funcBody = funcBody;

                PERF_COUNTER_DEC(Code, DeferredFunction);

                if (!this->GetSourceContextInfo()->IsDynamic())
                {
                    PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d; Is Top Level: %s; Source Url: %s\n"), m_functionNumber, this->GetDisplayName(), this->m_cchLength, this->GetNestedCount(), this->m_utf8SourceInfo->GetSourceInfoId(), this->m_utf8SourceInfo->GetCchLength(), this->GetIsTopLevel() ? _u("True") : _u("False"), this->GetSourceContextInfo()->url);
                }
                else
                {
                    PHASE_PRINT_TESTTRACE1(Js::DeferParsePhase, _u("TestTrace: Deferred function parsed - ID: %d; Display Name: %s; Length: %d; Nested Function Count: %d; Utf8SourceInfo: %d; Source Length: %d\n; Is Top Level: %s;"), m_functionNumber, this->GetDisplayName(), this->m_cchLength, this->GetNestedCount(),  this->m_utf8SourceInfo->GetSourceInfoId(), this->m_utf8SourceInfo->GetCchLength(), this->GetIsTopLevel() ? _u("True") : _u("False"));
                }

                if (!this->GetIsTopLevel() &&
                    !this->GetSourceContextInfo()->IsDynamic() &&
                    this->m_scriptContext->DoUndeferGlobalFunctions())
                {
                    this->GetUtf8SourceInfo()->UndeferGlobalFunctions([this](const Utf8SourceInfo::DeferredFunctionsDictionary::EntryType& func)
                    {
                        Js::ParseableFunctionInfo *nextFunc = func.Value();
                        JavascriptExceptionObject* pExceptionObject = nullptr;

                        if (nextFunc != nullptr && this != nextFunc)
                        {
                            try
                            {
                                nextFunc->Parse();
                            }
                            catch (OutOfMemoryException) {}
                            catch (StackOverflowException) {}
                            catch (const Js::JavascriptException& err)
                            {
                                pExceptionObject = err.GetAndClear();
                            }

                            // Do not do anything with an OOM or SOE, returning true is fine, it will then be undeferred (or attempted to again when called)
                            if (pExceptionObject)
                            {
                                if (pExceptionObject != ThreadContext::GetContextForCurrentThread()->GetPendingOOMErrorObject() &&
                                    pExceptionObject != ThreadContext::GetContextForCurrentThread()->GetPendingSOErrorObject())
                                {
                                    JavascriptExceptionOperators::DoThrow(pExceptionObject, /*scriptContext*/nullptr);
                                }
                            }
                        }

                        return true;
                    });
                }
            }
            else
            {
                bool isDebugReparse = m_scriptContext->IsScriptContextInSourceRundownOrDebugMode() && !this->GetUtf8SourceInfo()->GetIsLibraryCode();
                bool isAsmJsReparse = m_isAsmjsMode && !isDebugReparse;

                isDebugOrAsmJsReparse = isAsmJsReparse || isDebugReparse;

                funcBody = this->GetFunctionBody();

                // As we have a valid function body already clear the restore data
                autoRestoreFunctionInfo.Clear();

                if (isDebugOrAsmJsReparse)
                {
#if ENABLE_DEBUG_CONFIG_OPTIONS
                    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
#if DBG
                    Assert(
                        funcBody->IsReparsed()
                        || m_scriptContext->IsScriptContextInSourceRundownOrDebugMode()
                        || m_isAsmjsMode);
#endif
                    OUTPUT_TRACE(Js::DebuggerPhase, _u("Full nested reparse of function: %s (%s)\n"), funcBody->GetDisplayName(), funcBody->GetDebugNumberSet(debugStringBuffer));

                    if (funcBody->GetByteCode())
                    {
                        // The current function needs to be cleaned up before getting generated in the debug mode.
                        funcBody->CleanupToReparse();
                    }

                }
            }

            // Note that we may be trying to re-gen an already-completed function. (This can happen, for instance,
            // in the case of named function expressions inside "with" statements in compat mode.)
            // In such a case, there's no work to do.
            if (funcBody->GetByteCode() == nullptr)
            {
#if ENABLE_PROFILE_INFO
                Assert(!funcBody->HasExecutionDynamicProfileInfo());
#endif
                // In debug or asm.js mode, the scriptlet will be asked to recompile again.

                HRESULT hr = NO_ERROR;
                HRESULT hrParser = NO_ERROR;
                HRESULT hrParseCodeGen = NO_ERROR;

                BEGIN_LEAVE_SCRIPT_INTERNAL(m_scriptContext)
                {
                    bool isCesu8 = m_scriptContext->GetSource(funcBody->GetSourceIndex())->IsCesu8();

                    size_t offset = this->StartOffset();
                    charcount_t charOffset = this->StartInDocument();
                    size_t length = this->LengthInBytes();

                    LPCUTF8 pszStart = this->GetStartOfDocument();

                    uint32 grfscr = funcBody->GetGrfscr() | fscrDeferredFnc;

                    // For the global function we want to re-use the glo functionbody which is already created in the non-debug mode
                    if (!funcBody->GetIsGlobalFunc())
                    {
                        grfscr &= ~fscrGlobalCode;
                    }

                    if (!funcBody->GetIsDeclaration() && !funcBody->GetIsGlobalFunc()) // No refresh may reparse global function (e.g. eval code)
                    {
                        // Notify the parser that the top-level function was defined in an expression,
                        // (not a function declaration statement).
                        grfscr |= fscrDeferredFncExpression;
                    }

                    if (funcBody->IsMethod())
                    {
                        grfscr |= fscrDeferredFncIsMethod;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsMethod;
                    }

                    if (funcBody->IsAsync())
                    {
                        grfscr |= fscrDeferredFncIsAsync;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsAsync;
                    }

                    if (funcBody->IsGenerator())
                    {
                        grfscr |= fscrDeferredFncIsGenerator;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsGenerator;
                    }

                    if (funcBody->IsClassConstructor())
                    {
                        grfscr |= fscrDeferredFncIsClassConstructor;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsClassConstructor;
                    }

                    if (funcBody->IsBaseClassConstructor())
                    {
                        grfscr |= fscrDeferredFncIsBaseClassConstructor;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsBaseClassConstructor;
                    }

                    if (funcBody->IsClassMethod())
                    {
                        grfscr |= fscrDeferredFncIsClassMember;
                    }
                    else
                    {
                        grfscr &= ~fscrDeferredFncIsClassMember;
                    }

                    if (isDebugOrAsmJsReparse)
                    {
                        // Disable deferred parsing if not DeferNested, or doing a debug/asm.js re-parse
                        // Disable asm.js when debugging or if linking failed
                        // Disable parser state cache if we're debugging or reparsing asm.js
                        grfscr = fscrNoAsmJs | (grfscr & ~(fscrWillDeferFncParse | fscrCreateParserState));
                    }

                    BEGIN_TRANSLATE_EXCEPTION_TO_HRESULT
                    {
                        CompileScriptException se;
                        Parser ps(m_scriptContext, funcBody->GetIsStrictMode() ? TRUE : FALSE);
                        ParseNodeProg * parseTree = nullptr;

                        uint nextFunctionId = funcBody->GetLocalFunctionId();
                        hrParser = ps.ParseSourceWithOffset(&parseTree, pszStart, offset, length, charOffset, isCesu8, grfscr, &se,
                            &nextFunctionId, funcBody->GetRelativeLineNumber(), funcBody->GetSourceContextInfo(),
                            funcBody);
                        // Assert(FAILED(hrParser) || nextFunctionId == funcBody->deferredParseNextFunctionId || isDebugOrAsmJsReparse || isByteCodeDeserialization);

                        if (FAILED(hrParser))
                        {
                            hrParseCodeGen = MapDeferredReparseError(hrParser, se); // Map certain errors like OOM/SOE
                            AssertMsg(hrParseCodeGen == JSERR_AsmJsCompileError // AsmJsCompileError is not a syntax error
                                || (FAILED(hrParseCodeGen) && SUCCEEDED(hrParser)), "Syntax errors should never be detected on deferred re-parse");
                        }
                        else
                        {
                            TRACE_BYTECODE(_u("\nDeferred parse %s\n"), funcBody->GetDisplayName());
                            Js::AutoDynamicCodeReference dynamicFunctionReference(m_scriptContext);

                            bool forceNoNative = isDebugOrAsmJsReparse ? this->GetScriptContext()->IsInterpreted() : false;

                            ParseableFunctionInfo* rootFunc = funcBody->GetParseableFunctionInfo();
                            hrParseCodeGen = GenerateByteCode(parseTree, grfscr, m_scriptContext,
                                &rootFunc, funcBody->GetSourceIndex(),
                                forceNoNative, &ps, &se, funcBody->GetScopeInfo(), functionRef);
                            funcBody->SetParseableFunctionInfo(rootFunc);

                            if (SUCCEEDED(hrParseCodeGen))
                            {
                                fParsed = TRUE;
                            }
                            else
                            {
                                Assert(hrParseCodeGen == SCRIPT_E_RECORDED);
                                hrParseCodeGen = se.ei.scode;
                            }
                        }
                    }
                    END_TRANSLATE_EXCEPTION_TO_HRESULT(hr);
                }
                END_LEAVE_SCRIPT_INTERNAL(m_scriptContext);

                THROW_KNOWN_HRESULT_EXCEPTIONS(hr, m_scriptContext);

                Assert(hr == NO_ERROR);

                if (!SUCCEEDED(hrParser))
                {
                    JavascriptError::ThrowError(m_scriptContext, VBSERR_InternalError);
                }
                else if (!SUCCEEDED(hrParseCodeGen))
                {
                    /*
                     * VBSERR_OutOfStack is of type kjstError but we throw a (more specific) StackOverflowError when a hard stack
                     * overflow occurs. To keep the behavior consistent I'm special casing it here.
                     */
                    if (hrParseCodeGen == VBSERR_OutOfStack)
                    {
                        JavascriptError::ThrowStackOverflowError(m_scriptContext);
                    }
                    else if (hrParseCodeGen == JSERR_AsmJsCompileError)
                    {
                        asmjsParseFailed = true;
                    }
                    else
                    {
                        JavascriptError::MapAndThrowError(m_scriptContext, hrParseCodeGen);
                    }
                }
            }
            else
            {
                fParsed = FALSE;
            }